

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall CVmDateLocale::set(CVmDateLocale *this,CVmUndo *undo,int idx,vm_val_t *val)

{
  long lVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  CVmObjPageEntry *pCVar5;
  bool bVar6;
  vm_val_t nil;
  
  if (this->vec == (CVmObjVector *)0x0) {
    pCVar5 = (CVmObjPageEntry *)0x0;
    vVar2 = CVmObjVector::create(0,0xf);
    this->vecid = vVar2;
    if (vVar2 != 0) {
      iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[vVar2 >> 0xc] + (vVar2 & 0xfff),
                         CVmObjVector::metaclass_reg_);
      if (iVar3 == 0) {
        pCVar5 = (CVmObjPageEntry *)0x0;
      }
      else {
        pCVar5 = G_obj_table_X.pages_[this->vecid >> 0xc] + (this->vecid & 0xfff);
      }
    }
    this->vec = (CVmObjVector *)pCVar5;
    nil.typ = VM_NIL;
    iVar3 = 0xf;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      CVmObjVector::append_element(this->vec,this->vecid,&nil);
    }
    vVar2 = this->vecid;
    CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
    vVar4 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
    (**(code **)(*(long *)&G_obj_table_X.pages_[vVar4 >> 0xc][vVar4 & 0xfff].ptr_ + 8))
              (G_obj_table_X.pages_[vVar4 >> 0xc] + (vVar4 & 0xfff),CVmObjClass::metaclass_reg_);
    vVar4 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
    pCVar5 = G_obj_table_X.pages_[vVar4 >> 0xc];
    lVar1 = *(long *)((long)&pCVar5[vVar4 & 0xfff].ptr_ + 8);
    *(undefined4 *)(lVar1 + 8) = 5;
    *(vm_obj_id_t *)(lVar1 + 0x10) = vVar2;
    *(undefined4 *)(*(long *)((long)&pCVar5[vVar4 & 0xfff].ptr_ + 8) + 0x18) = 1;
  }
  if ((uint)idx < 0xf) {
    CVmObjVector::set_element_undo(this->vec,this->vecid,(ulong)(uint)idx,val);
    return;
  }
  err_throw(0x7df);
}

Assistant:

void set(VMG_ CVmUndo *undo, int idx, const vm_val_t *val)
    {
        /* if we don't have a vector, create one */
        if (vec == 0)
        {
            /* create the vector */
            vecid = CVmObjVector::create(vmg_ FALSE, ndefaults);
            vec = vm_objid_cast(CVmObjVector, vecid);

            /* initialize all elements to nil */
            vm_val_t nil;
            nil.set_nil();
            for (int i = 0 ; i < ndefaults ; ++i)
                vec->append_element(vmg_ vecid, &nil);

            /* store the vector in the class object's state holder */
            vm_val_t val;
            val.set_obj(vecid);
            vm_classobj_for(CVmObjDate)->set_class_state(&val);
        }

        /* if it's out of bounds, it's an error */
        if (idx < 0 || idx >= ndefaults)
            err_throw(VMERR_INDEX_OUT_OF_RANGE);

        /* set the specified element */
        vec->set_element_undo(vmg_ vecid, idx, val);
    }